

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O2

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,LengthExpression *expression)

{
  int iVar1;
  Expression *expression_00;
  ExpressionWrapper *pEVar2;
  undefined4 extraout_var;
  MemExpression *this_00;
  
  expression_00 = IRT::FrameTranslator::GetAddress(this->current_frame_,&expression->variable_name_)
  ;
  pEVar2 = (ExpressionWrapper *)operator_new(0x10);
  IRT::ExpressionWrapper::ExpressionWrapper(pEVar2,expression_00);
  iVar1 = (*(pEVar2->super_SubtreeWrapper)._vptr_SubtreeWrapper[2])(pEVar2);
  pEVar2 = (ExpressionWrapper *)operator_new(0x10);
  this_00 = (MemExpression *)operator_new(0x10);
  IRT::MemExpression::MemExpression(this_00,(Expression *)CONCAT44(extraout_var,iVar1));
  IRT::ExpressionWrapper::ExpressionWrapper(pEVar2,(Expression *)this_00);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pEVar2;
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(LengthExpression* expression) {
  auto address = current_frame_->GetAddress(expression->variable_name_);
  auto array_ident_expr = (new IRT::ExpressionWrapper(address))->ToExpression();

  tos_value_ =
      new IRT::ExpressionWrapper(new IRT::MemExpression(array_ident_expr));
}